

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O0

ON_wString __thiscall ON_wString::ToMemorySize(ON_wString *this,size_t size_in_bytes)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double x;
  ON__UINT64 r;
  ON__UINT64 n;
  ON__UINT64 pb;
  ON__UINT64 tb;
  ON__UINT64 gb;
  ON__UINT64 mb;
  ON__UINT64 kb;
  wchar_t *units;
  ON__UINT64 sz;
  size_t size_in_bytes_local;
  
  if (size_in_bytes == 0) {
    ON_wString(this,L"0 bytes");
  }
  else {
    if (size_in_bytes < 0x4000000000000) {
      if (size_in_bytes < 0x10000000000) {
        if (size_in_bytes < 0x40000000) {
          if (size_in_bytes < 0x100000) {
            if (size_in_bytes < 0x400) {
              if (size_in_bytes == 1) {
                ON_wString(this,L"1 byte");
                return (ON_wString)(wchar_t *)this;
              }
              FormatToString((wchar_t *)this,L"%u bytes",size_in_bytes & 0xffffffff);
              return (ON_wString)(wchar_t *)this;
            }
            kb = (ON__UINT64)anon_var_dwarf_460c2f;
            units = (wchar_t *)size_in_bytes;
          }
          else {
            units = (wchar_t *)(size_in_bytes >> 10);
            kb = (ON__UINT64)anon_var_dwarf_460c24;
          }
        }
        else {
          units = (wchar_t *)(size_in_bytes >> 0x14);
          kb = (ON__UINT64)anon_var_dwarf_460c19;
        }
      }
      else {
        units = (wchar_t *)(size_in_bytes >> 0x1e);
        kb = (ON__UINT64)anon_var_dwarf_460c0e;
      }
    }
    else {
      units = (wchar_t *)(size_in_bytes >> 0x28);
      kb = (ON__UINT64)anon_var_dwarf_460bf7;
    }
    uVar1 = (ulong)units >> 10;
    if ((((ulong)units & 0x3ff) == 0) || (99 < uVar1)) {
      FormatToString((wchar_t *)this,L"%u %ls",uVar1 & 0xffffffff,kb);
    }
    else {
      auVar3._8_4_ = (int)((ulong)units >> 0x20);
      auVar3._0_8_ = units;
      auVar3._12_4_ = 0x45300000;
      dVar2 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)units) - 4503599627370496.0)) / 1024.0;
      if (uVar1 == 0) {
        FormatToString((wchar_t *)this,dVar2,L"%0.03f %ls",kb);
      }
      else if (uVar1 < 10) {
        FormatToString((wchar_t *)this,dVar2,L"%0.2f %ls",kb);
      }
      else {
        FormatToString((wchar_t *)this,dVar2,L"%0.1f %ls",kb);
      }
    }
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::ToMemorySize(size_t size_in_bytes)
{
  if (size_in_bytes <= 0)
    return ON_wString(L"0 bytes");

  ON__UINT64 sz = (ON__UINT64)size_in_bytes;

  const wchar_t* units;
  const ON__UINT64 kb = 1024;
  const ON__UINT64 mb = kb * kb;
  const ON__UINT64 gb = kb * mb;
  const ON__UINT64 tb = kb * gb;
  const ON__UINT64 pb = kb * tb;
  if (sz >= pb)
  {
    // petabytes
    sz /= tb;
    units = L"PB";
  }
  else if (sz >= tb)
  {
    // terabytes
    sz /= gb;
    units = L"TB";
  }
  else if (sz >= gb)
  {
    // gigabytes
    sz /= mb;
    units = L"GB";
  }
  else if (sz >= mb)
  {
    // megaabytes
    sz /= kb;
    units = L"MB";
  }
  else if (sz >= kb)
  {
    // kilobytes
    units = L"KB";
  }
  else
  {
    // bytes
    return  (1==sz) ? ON_wString(L"1 byte") : ON_wString::FormatToString(L"%u bytes",(unsigned)sz);
  }

  const ON__UINT64 n = sz / kb;
  const ON__UINT64 r = sz % kb;
  if (r > 0 && n < 100)
  {
    const double x = ((double)sz)/((double)kb);
    if (0 == n)
      return ON_wString::FormatToString(L"%0.03f %ls", x, units);

    if (n >= 10)
      return ON_wString::FormatToString(L"%0.1f %ls", x, units);

    return ON_wString::FormatToString(L"%0.2f %ls", x, units);
  }

  return ON_wString::FormatToString(L"%u %ls", ((unsigned)n), units);
}